

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O2

int encode_write(char *data,int len)

{
  int iVar1;
  uchar buf [128];
  
  buf[0] = '\t';
  iVar1 = encode((uchar *)data,len,buf + 1,0x7e);
  buf[(long)iVar1 + 1] = '\n';
  iVar1 = serial_write((char *)buf,iVar1 + 2);
  if (iVar1 < 1) {
    iVar1 = -1;
  }
  else {
    serial_flush_out();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int encode_write(char* data, int len)
{
  unsigned char buf[128];
  int encode_len, ret;

  buf[0] = COMMUNICATION_START_BYTE;
  encode_len = encode((unsigned char*)data, len, buf + 1, 126);
  buf[encode_len + 1] = COMMUNICATION_END_BYTE;

  ret = serial_write((char*)buf, encode_len + 2);
  if (ret <= 0)
  {
    return -1;
  }
  serial_flush_out();

  return 0;
}